

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.h
# Opt level: O3

shared_ptr<chrono::ChNodeBase> __thiscall chrono::ChMatterSPH::GetNode(ChMatterSPH *this,uint n)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  pointer pcVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChNodeBase> sVar7;
  
  uVar4 = in_RDX & 0xffffffff;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            (CONCAT44(in_register_00000034,n) + 0x78);
  if (uVar4 < (ulong)(*(long *)(CONCAT44(in_register_00000034,n) + 0x80) - (long)p_Var1 >> 4)) {
    pp_Var2 = p_Var1[uVar4]._vptr__Sp_counted_base;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x0;
      _Var6._M_pi = p_Var1;
    }
    else {
      pp_Var5 = (_func_int **)
                ((long)pp_Var2 +
                (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var2)[-8].
                      _vptr__Sp_counted_base);
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var2;
    }
    (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var5;
    pcVar3 = *(pointer *)&p_Var1[uVar4]._M_use_count;
    (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = pcVar3;
    if (pcVar3 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar3 + 8) = *(int *)(pcVar3 + 8) + 1;
      }
    }
    sVar7.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    sVar7.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<chrono::ChNodeBase>)
           sVar7.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("n < nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.h"
                ,0x105,
                "virtual std::shared_ptr<ChNodeBase> chrono::ChMatterSPH::GetNode(unsigned int)");
}

Assistant:

virtual std::shared_ptr<ChNodeBase> GetNode(unsigned int n) override {
        assert(n < nodes.size());
        return nodes[n];
    }